

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::PixelStatsAccumulator::ReportCounter
          (PixelStatsAccumulator *this,Point2i *p,int statIndex,char *name,int64_t val)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  Point2i p_00;
  WrapMode2D wrapMode;
  Point2i p_01;
  bool bVar1;
  Image *pIVar2;
  reference this_00;
  char *in_RCX;
  Image *this_01;
  int in_EDX;
  long *in_RDI;
  Point2i pp;
  Point2i res;
  Image *im;
  Image *in_stack_fffffffffffffd78;
  Image *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  size_type in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string *local_230;
  int in_stack_fffffffffffffe00;
  WrapMode in_stack_fffffffffffffe04;
  WrapMode WVar3;
  WrapMode WVar4;
  int iStack_1ec;
  undefined8 local_1e0;
  Image *local_1d8;
  allocator<char> local_1b1;
  string *local_1b0;
  string local_1a8 [32];
  string *local_188;
  undefined8 local_180;
  ColorEncodingHandle *in_stack_fffffffffffffe90;
  PixelFormat format;
  Image *in_stack_fffffffffffffea0;
  Allocator in_stack_fffffffffffffea8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffec0;
  Tuple2<pbrt::Point2,_int> local_48;
  Tuple2<pbrt::Vector2,_int> local_40;
  Point2<int> local_38;
  reference local_30;
  char *local_20;
  int local_14;
  
  this_01 = (Image *)(long)in_EDX;
  local_20 = in_RCX;
  local_14 = in_EDX;
  pIVar2 = (Image *)std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                              ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)
                               (*in_RDI + 0x130));
  if (pIVar2 <= this_01) {
    std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(*in_RDI + 0x118),(long)local_14);
    std::__cxx11::string::operator=((string *)this_00,local_20);
  }
  local_30 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                       ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x130),
                        (long)local_14);
  local_40 = (Tuple2<pbrt::Vector2,_int>)
             Bounds2<int>::Diagonal((Bounds2<int> *)in_stack_fffffffffffffd78);
  Point2<int>::Point2<int>
            ((Point2<int> *)in_stack_fffffffffffffd80,(Vector2<int> *)in_stack_fffffffffffffd78);
  local_48 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_30);
  bVar1 = Tuple2<pbrt::Point2,_int>::operator!=(&local_48,&local_38);
  if (bVar1) {
    local_1b0 = local_1a8;
    format = local_38.super_Tuple2<pbrt::Point2,_int>.y;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    local_188 = local_1a8;
    local_180 = 1;
    v._M_array._4_4_ = in_stack_fffffffffffffd8c;
    v._M_array._0_4_ = in_stack_fffffffffffffd88;
    v._M_len = in_stack_fffffffffffffd90;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffd80,v);
    ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd80);
    Image::Image(in_stack_fffffffffffffea0,format,(Point2i)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffe90,in_stack_fffffffffffffea8);
    Image::operator=(in_stack_fffffffffffffd80,local_1d8);
    Image::~Image(in_stack_fffffffffffffd80);
    local_230 = (string *)&local_188;
    in_stack_fffffffffffffd78 = local_1d8;
    do {
      local_230 = local_230 + -0x20;
      std::__cxx11::string::~string(local_230);
    } while (local_230 != local_1a8);
    std::allocator<char>::~allocator(&local_1b1);
  }
  Point2<int>::operator-((Point2<int> *)in_stack_fffffffffffffd78,(Point2<int> *)0x907815);
  Point2<int>::Point2<int>
            ((Point2<int> *)in_stack_fffffffffffffd80,(Vector2<int> *)in_stack_fffffffffffffd78);
  WVar3 = (WrapMode)local_1e0;
  iStack_1ec = (int)((ulong)local_1e0 >> 0x20);
  WVar4 = WVar3;
  WrapMode2D::WrapMode2D((WrapMode2D *)local_30,(WrapMode)((ulong)local_30 >> 0x20));
  p_01.super_Tuple2<pbrt::Point2,_int>.y = WVar4;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = iStack_1ec;
  wrapMode.wrap.values[1] = WVar3;
  wrapMode.wrap.values[0] = in_stack_fffffffffffffe04;
  Image::GetChannel(this_01,p_01,(int)((ulong)in_RDI >> 0x20),wrapMode);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffe04;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffe00;
  Image::SetChannel(this_01,p_00,(int)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  return;
}

Assistant:

void PixelStatsAccumulator::ReportCounter(const Point2i &p, int statIndex,
                                          const char *name, int64_t val) {
    if (statIndex >= stats->counterImages.size()) {
        stats->counterImages.resize(statIndex + 1);
        stats->counterNames.resize(statIndex + 1);
        stats->counterNames[statIndex] = name;
    }

    Image &im = stats->counterImages[statIndex];
    Point2i res = Point2i(imageBounds.Diagonal());
    if (im.Resolution() != res)
        im = Image(PixelFormat::Float, res, {"count"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    im.SetChannel(pp, 0, im.GetChannel(pp, 0) + val);
}